

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManPermuteInputs(Gia_Man_t *p,int nPpis,int nExtra)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  int nExtra_local;
  int nPpis_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  pGVar5 = Gia_ManConst0(p);
  pGVar5->Value = 0;
  for (local_2c = 0; iVar1 = Gia_ManPiNum(p), local_2c < (iVar1 - nPpis) - nExtra;
      local_2c = local_2c + 1) {
    uVar2 = Gia_ManAppendCi(p_00);
    pGVar5 = Gia_ManCi(p,local_2c);
    pGVar5->Value = uVar2;
  }
  local_2c = Gia_ManPiNum(p);
  for (local_2c = local_2c - nExtra; iVar1 = Gia_ManPiNum(p), local_2c < iVar1;
      local_2c = local_2c + 1) {
    uVar2 = Gia_ManAppendCi(p_00);
    pGVar5 = Gia_ManCi(p,local_2c);
    pGVar5->Value = uVar2;
  }
  iVar1 = Gia_ManPiNum(p);
  for (local_2c = (iVar1 - nPpis) - nExtra; iVar1 = Gia_ManPiNum(p), local_2c < iVar1 - nExtra;
      local_2c = local_2c + 1) {
    uVar2 = Gia_ManAppendCi(p_00);
    pGVar5 = Gia_ManCi(p,local_2c);
    pGVar5->Value = uVar2;
  }
  for (local_2c = Gia_ManPiNum(p); iVar1 = Gia_ManCiNum(p), local_2c < iVar1;
      local_2c = local_2c + 1) {
    uVar2 = Gia_ManAppendCi(p_00);
    pGVar5 = Gia_ManCi(p,local_2c);
    pGVar5->Value = uVar2;
  }
  iVar1 = Gia_ManCiNum(p_00);
  iVar3 = Gia_ManCiNum(p);
  if (iVar1 != iVar3) {
    __assert_fail("Gia_ManCiNum(pNew) == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x9bf,"Gia_Man_t *Gia_ManPermuteInputs(Gia_Man_t *, int, int)");
  }
  local_2c = 0;
  while( true ) {
    bVar6 = false;
    if (local_2c < p->nObjs) {
      pGStack_28 = Gia_ManObj(p,local_2c);
      bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjIsAnd(pGStack_28);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy(pGStack_28);
      iVar3 = Gia_ObjFanin1Copy(pGStack_28);
      uVar2 = Gia_ManAppendAnd(p_00,iVar1,iVar3);
      pGStack_28->Value = uVar2;
    }
    local_2c = local_2c + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar6 = false;
    if (local_2c < iVar1) {
      pGStack_28 = Gia_ManCo(p,local_2c);
      bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjFanin0Copy(pGStack_28);
    uVar2 = Gia_ManAppendCo(p_00,iVar1);
    pGStack_28->Value = uVar2;
    local_2c = local_2c + 1;
  }
  iVar1 = Gia_ManRegNum(p);
  Gia_ManSetRegNum(p_00,iVar1);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManPermuteInputs( Gia_Man_t * p, int nPpis, int nExtra )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    for ( i = 0; i < Gia_ManPiNum(p) - nPpis - nExtra; i++ ) // regular PIs
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi( pNew );
    for ( i = Gia_ManPiNum(p) - nExtra; i < Gia_ManPiNum(p); i++ ) // extra PIs due to DC values
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi( pNew );
    for ( i = Gia_ManPiNum(p) - nPpis - nExtra; i < Gia_ManPiNum(p) - nExtra; i++ ) // pseudo-PIs
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi( pNew );
    for ( i = Gia_ManPiNum(p); i < Gia_ManCiNum(p); i++ ) // flop outputs
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi( pNew );
    assert( Gia_ManCiNum(pNew) == Gia_ManCiNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}